

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

bool DepParserTask::initialize::anon_class_1_0_00000001::__invoke(polylabel *l)

{
  bool bVar1;
  polylabel *in_stack_ffffffffffffffe8;
  anon_class_1_0_00000001 *in_stack_fffffffffffffff0;
  
  bVar1 = operator()(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return bVar1;
}

Assistant:

void finish(Search::search &sch)
{
  task_data *data = sch.get_task_data<task_data>();
  data->valid_actions.delete_v();
  data->valid_action_temp.delete_v();
  data->gold_heads.delete_v();
  data->gold_tags.delete_v();
  data->stack.delete_v();
  data->heads.delete_v();
  data->tags.delete_v();
  data->temp.delete_v();
  data->action_loss.delete_v();
  data->gold_actions.delete_v();
  data->gold_action_losses.delete_v();
  data->gold_action_temp.delete_v();
  VW::dealloc_example(COST_SENSITIVE::cs_label.delete_label, *data->ex);
  free(data->ex);
  for (size_t i = 0; i < 6; i++) data->children[i].delete_v();
  delete data;
}